

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O2

bool __thiscall crnlib::vec<2U,_float>::operator<(vec<2U,_float> *this,vec<2U,_float> *rhs)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    uVar4 = uVar3;
    if (uVar3 == 2) goto LAB_0016e76f;
    fVar1 = this->m_s[uVar3];
    fVar2 = rhs->m_s[uVar3];
    if (fVar1 < fVar2) {
      uVar4 = 1;
      goto LAB_0016e76f;
    }
  } while ((fVar1 == fVar2) && (uVar4 = uVar3 + 1, !NAN(fVar1) && !NAN(fVar2)));
  uVar4 = 0;
LAB_0016e76f:
  return (bool)(uVar3 < 2 & (byte)uVar4);
}

Assistant:

inline bool operator<(const vec& rhs) const {
    for (uint i = 0; i < N; i++) {
      if (m_s[i] < rhs.m_s[i])
        return true;
      else if (!(m_s[i] == rhs.m_s[i]))
        return false;
    }

    return false;
  }